

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

connector *
transform_join_list(connector *join,wchar_t nrow,wchar_t ncol,wchar_t y0,wchar_t x0,wchar_t rotate,
                   _Bool reflect)

{
  loc_conflict lVar1;
  connector *pcVar2;
  wchar_t wVar3;
  connector **ppcVar4;
  connector *result;
  connector *local_38;
  
  local_38 = (connector *)0x0;
  if (join != (connector *)0x0) {
    ppcVar4 = &local_38;
    do {
      lVar1 = loc((join->grid).x - y0,(join->grid).y);
      if ((((-1 < (long)lVar1) && (wVar3 = lVar1.x, wVar3 < ncol)) && (L'\xffffffff' < wVar3)) &&
         (lVar1.y < nrow)) {
        pcVar2 = (connector *)mem_zalloc(0x20);
        *ppcVar4 = pcVar2;
        (pcVar2->grid).x = wVar3;
        (pcVar2->grid).y = lVar1.y;
        pcVar2->feat = join->feat;
        ppcVar4 = &pcVar2->next;
      }
      join = join->next;
    } while (join != (connector *)0x0);
  }
  return local_38;
}

Assistant:

static struct connector *transform_join_list(const struct connector *join,
		int nrow, int ncol, int y0, int x0, int rotate, bool reflect)
{
	/*
	 * The transformation specified by the arguments is that to map the
	 * chunk to the untransformed coordinates of the connections.  Invert
	 * that to get the transformation to apply to the connections.  Mimic
	 * the logic symmetry_transform().
	 */
	struct connector *result = NULL;
	struct connector **next_link = &result;
	int ntcol, ntrow, i;

	/*
	 * Get the dimensions of the chunk after the forward (chunk to
	 * untransformed connection coordinates) transform.
	 */
	ntrow = nrow;
	ntcol = ncol;
	for (i = 0; i < rotate % 4; ++i) {
		int temp = ntrow;

		ntrow = ntcol;
		ntcol = temp;
	}

	for (; join; join = join->next) {
		/* Undo the translation. */
		struct loc g = loc(join->grid.x - x0, join->grid.y - y0);
		int rheight = nrow, rwidth = ncol;

		/* Only keep the ones that are in bounds for the chunk. */
		if (g.y < 0 || g.y >= nrow || g.x < 0 || g.x >= ncol) continue;

		/* Undo the reflection. */
		if (reflect) {
			g.x = ncol - 1 - g.x;
		}

		/* Undo the rotations. */
		for (i = 0; i < rotate % 4; ++i) {
			int temp = g.y;

			g.y = rwidth - 1 - g.x;
			g.x = temp;
			temp = rwidth;
			rwidth = rheight;
			rheight = temp;
		}

		*next_link = mem_zalloc(sizeof(**next_link));
		(*next_link)->grid = g;
		(*next_link)->feat = join->feat;
		next_link = &((*next_link)->next);
	}

	return result;
}